

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.h
# Opt level: O0

vec4f * __thiscall
GouraudShader::vertex
          (vec4f *__return_storage_ptr__,GouraudShader *this,Model *model,int iface,int nthvert)

{
  size_t idx;
  double *pdVar1;
  double dVar2;
  vec<4UL,_double> local_188;
  vec<4UL,_double> local_168;
  vec3f local_148;
  vec<4UL,_double> local_130;
  vec<3UL,_double> local_110;
  mat<4UL,_4UL> local_f8;
  vec<4UL,_double> local_78;
  vec3f local_58;
  undefined1 local_40 [8];
  vec4f gl_Vertex;
  int nthvert_local;
  int iface_local;
  Model *model_local;
  GouraudShader *this_local;
  
  gl_Vertex.data[3]._0_4_ = nthvert;
  gl_Vertex.data[3]._4_4_ = iface;
  Model::vert(&local_58,model,(long)iface,(long)nthvert);
  embed<4ul,3ul,double>((vec<4UL,_double> *)local_40,&local_58,1.0);
  operator*(&local_f8,&(this->super_IShader).uniform_Projection,
            &(this->super_IShader).uniform_ModelView);
  operator*(&local_78,&local_f8,(vec<4UL,_double> *)local_40);
  local_40 = (undefined1  [8])local_78.data[0];
  gl_Vertex.data[0] = local_78.data[1];
  gl_Vertex.data[1] = local_78.data[2];
  gl_Vertex.data[2] = local_78.data[3];
  idx = (size_t)gl_Vertex.data[3]._0_4_;
  pdVar1 = vec<4UL,_double>::operator[]((vec<4UL,_double> *)local_40,3);
  operator/(&local_130,(vec<4UL,_double> *)local_40,pdVar1);
  proj<3ul,4ul,double>(&local_110,&local_130);
  mat<3UL,_3UL>::set_col(&this->varying_tri,idx,&local_110);
  Model::normal(&local_148,model,(long)gl_Vertex.data[3]._4_4_,(long)gl_Vertex.data[3]._0_4_);
  dVar2 = dot<3ul,double>(&local_148,&this->uniform_light_dir);
  dVar2 = clamp<double>(dVar2,0.0,1.0);
  pdVar1 = vec<3UL,_double>::operator[](&this->varying_ity,(long)gl_Vertex.data[3]._0_4_);
  *pdVar1 = dVar2;
  operator*(&local_168,&(this->super_IShader).uniform_Viewport,(vec<4UL,_double> *)local_40);
  local_40 = (undefined1  [8])local_168.data[0];
  gl_Vertex.data[0] = local_168.data[1];
  gl_Vertex.data[1] = local_168.data[2];
  gl_Vertex.data[2] = local_168.data[3];
  pdVar1 = vec<4UL,_double>::operator[]((vec<4UL,_double> *)local_40,3);
  operator/(&local_188,(vec<4UL,_double> *)local_40,pdVar1);
  proj<4ul,4ul,double>(__return_storage_ptr__,&local_188);
  return __return_storage_ptr__;
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        vec4f gl_Vertex = embed<4>(model.vert(iface, nthvert));
        gl_Vertex = uniform_Projection * uniform_ModelView * gl_Vertex;
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));

        varying_ity[nthvert] = clamp(dot(model.normal(iface, nthvert), uniform_light_dir), 0., 1.);

        gl_Vertex = uniform_Viewport * gl_Vertex;
        return proj<4>(gl_Vertex / gl_Vertex[3]);
    }